

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteSwapper.h
# Opt level: O0

void __thiscall
Assimp::Intern::Getter<true,_signed_char,_true>::operator()
          (Getter<true,_signed_char,_true> *this,char *inout,bool le)

{
  ByteSwapper<signed_char,_false> local_1b;
  ByteSwapper<signed_char,_false> local_1a;
  byte local_19;
  char *pcStack_18;
  bool le_local;
  char *inout_local;
  Getter<true,_signed_char,_true> *this_local;
  
  local_19 = (le ^ 0xffU) & 1;
  pcStack_18 = inout;
  inout_local = (char *)this;
  if (local_19 == 0) {
    ByteSwapper<signed_char,_false>::operator()(&local_1b,inout);
  }
  else {
    ByteSwapper<signed_char,_false>::operator()(&local_1a,inout);
  }
  return;
}

Assistant:

void operator() (T* inout, bool le) {
#ifdef AI_BUILD_BIG_ENDIAN
        le =  le;
#else
        le =  !le;
#endif
        if (le) {
            ByteSwapper<T,(sizeof(T)>1?true:false)> () (inout);
        }
        else ByteSwapper<T,false> () (inout);
    }